

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O2

void __thiscall TRM::Bitmap::FlipHorizontally(Bitmap *this)

{
  uint uVar1;
  undefined4 uVar2;
  pointer pCVar3;
  int32_t i;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int32_t j;
  uint uVar7;
  int iVar8;
  
  uVar1 = this->fWidth;
  uVar5 = this->fHeight;
  if (uVar5 * uVar1 != 0) {
    for (uVar4 = 0; uVar4 != uVar1 >> 1; uVar4 = uVar4 + 1) {
      for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
        iVar8 = this->fWidth * uVar7;
        uVar5 = iVar8 + uVar4;
        pCVar3 = (this->fPixels).super__Vector_base<TRM::Color,_std::allocator<TRM::Color>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = this->fWidth + ~uVar4 + iVar8;
        uVar2 = *(undefined4 *)pCVar3[uVar5].fRGBA._M_elems;
        *(undefined4 *)pCVar3[uVar5].fRGBA._M_elems = *(undefined4 *)pCVar3[uVar6].fRGBA._M_elems;
        *(undefined4 *)pCVar3[uVar6].fRGBA._M_elems = uVar2;
        uVar5 = this->fHeight;
      }
    }
  }
  return;
}

Assistant:

void Bitmap::FlipHorizontally() {
  if (fWidth * fHeight <= 0) {
    return;
  }

  int32_t half_width = fWidth >> 1;
  for (int32_t i = 0; i < half_width; i++) {
    for (int32_t j = 0; j < fHeight; j++) {
      std::swap(fPixels[i + j * fWidth], fPixels[fWidth - 1 - i + j * fWidth]);
    }
  }
}